

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_tunnel_linux.c
# Opt level: O3

int os_tunnel_linux_remove(os_tunnel *tunnel)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -1;
  if (((tunnel->_node).list.next != (list_entity *)0x0) &&
     ((tunnel->_node).list.prev != (list_entity *)0x0)) {
    iVar1 = _handle_tunnel(tunnel,false);
    if (iVar1 == 0) {
      avl_remove(&_tunnel_tree,&tunnel->_node);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
os_tunnel_linux_remove(struct os_tunnel *tunnel) {
  int result;

  if (!avl_is_node_added(&tunnel->_node)) {
    return -1;
  }

  result = _handle_tunnel(tunnel, false);
  if (!result) {
    avl_remove(&_tunnel_tree, &tunnel->_node);
  }
  return result;
}